

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_substring_after
              (lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyxp_set *plVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  size_t sVar6;
  lys_node *plVar7;
  char *pcVar8;
  long lVar9;
  uint32_t uVar10;
  uint uVar11;
  ly_ctx *plVar12;
  lyd_node *plVar13;
  
  plVar1 = *args;
  if ((options & 0x1cU) == 0) {
    iVar2 = lyxp_set_cast(plVar1,LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = lyxp_set_cast(args[1],LYXP_SET_STRING,cur_node,param_4,options);
    if (iVar2 != 0) {
      return -1;
    }
    pcVar8 = (args[1]->val).str;
    pcVar4 = strstr(((*args)->val).str,pcVar8);
    if (pcVar4 != (char *)0x0) {
      sVar5 = strlen(pcVar8);
      sVar6 = strlen(pcVar4 + sVar5);
      set_fill_string(set,pcVar4 + sVar5,(uint16_t)sVar6);
      return 0;
    }
    set_fill_string(set,"",0);
    return 0;
  }
  iVar2 = 0;
  if (plVar1->type == LYXP_SET_SNODE_SET) {
    uVar10 = plVar1->used;
    plVar13 = (lyd_node *)0x0;
    do {
      uVar10 = uVar10 - 1;
      if ((plVar1->val).nodes[uVar10].pos == 1) {
        plVar13 = (plVar1->val).nodes[uVar10].node;
        break;
      }
    } while (uVar10 != 0);
    iVar2 = 0;
    if (plVar13 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar13->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar12 = param_4->ctx;
        plVar7 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar13->ht);
        pcVar8 = "Argument #1 of %s is a %s node \"%s\".";
      }
      else {
        iVar3 = warn_is_string_type((lys_type *)&plVar13[1].ht);
        if (iVar3 != 0) goto LAB_00183b96;
        plVar12 = param_4->ctx;
        plVar7 = plVar13->schema;
        pcVar8 = "Argument #1 of %s is node \"%s\", not of string-type.";
      }
      iVar2 = 1;
      ly_log(plVar12,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_substring_after",plVar7);
    }
  }
LAB_00183b96:
  plVar1 = args[1];
  if (plVar1->type == LYXP_SET_SNODE_SET) {
    uVar11 = plVar1->used;
    plVar13 = (lyd_node *)0x0;
    do {
      uVar11 = uVar11 - 1;
      if ((plVar1->val).nodes[uVar11].pos == 1) {
        plVar13 = (plVar1->val).nodes[uVar11].node;
        break;
      }
    } while (uVar11 != 0);
    if (plVar13 != (lyd_node *)0x0) {
      if ((*(LYS_NODE *)&plVar13->ht & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
        plVar12 = param_4->ctx;
        plVar7 = (lys_node *)strnodetype(*(LYS_NODE *)&plVar13->ht);
        pcVar8 = "Argument #2 of %s is a %s node \"%s\".";
      }
      else {
        iVar3 = warn_is_string_type((lys_type *)&plVar13[1].ht);
        if (iVar3 != 0) goto LAB_00183c4a;
        plVar12 = param_4->ctx;
        plVar7 = plVar13->schema;
        pcVar8 = "Argument #2 of %s is node \"%s\", not of string-type.";
      }
      iVar2 = 1;
      ly_log(plVar12,LY_LLWRN,LY_SUCCESS,pcVar8,"xpath_substring_after",plVar7);
    }
  }
LAB_00183c4a:
  uVar11 = set->used;
  if ((ulong)uVar11 != 0) {
    lVar9 = 0;
    do {
      if (*(int *)((long)&((set->val).nodes)->pos + lVar9) == 1) {
        *(undefined4 *)((long)&((set->val).nodes)->pos + lVar9) = 0;
      }
      lVar9 = lVar9 + 0x10;
    } while ((ulong)uVar11 << 4 != lVar9);
  }
  return iVar2;
}

Assistant:

static int
xpath_substring_after(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node,
                      struct lys_module *local_mod, struct lyxp_set *set, int options)
{
    char *ptr;
    struct lys_node_leaf *sleaf;
    int ret = EXIT_SUCCESS;

    if (options & LYXP_SNODE_ALL) {
        if ((args[0]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[0]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #1 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }

        if ((args[1]->type == LYXP_SET_SNODE_SET) && (sleaf = (struct lys_node_leaf *)warn_get_snode_in_ctx(args[1]))) {
            if (!(sleaf->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is a %s node \"%s\".", __func__, strnodetype(sleaf->nodetype), sleaf->name);
                ret = EXIT_FAILURE;
            } else if (!warn_is_string_type(&sleaf->type)) {
                LOGWRN(local_mod->ctx, "Argument #2 of %s is node \"%s\", not of string-type.", __func__, sleaf->name);
                ret = EXIT_FAILURE;
            }
        }
        set_snode_clear_ctx(set);
        return ret;
    }

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }
    if (lyxp_set_cast(args[1], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    ptr = strstr(args[0]->val.str, args[1]->val.str);
    if (ptr) {
        set_fill_string(set, ptr + strlen(args[1]->val.str), strlen(ptr + strlen(args[1]->val.str)));
    } else {
        set_fill_string(set, "", 0);
    }

    return EXIT_SUCCESS;
}